

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void * get_base_component(ecs_world_t *world,ecs_stage_t *stage,ecs_entity_info_t *info,
                         ecs_entity_t component)

{
  ecs_vector_t *vector;
  _Bool _Var1;
  void *pvVar2;
  bool bVar3;
  undefined1 local_70 [8];
  ecs_entity_info_t prefab_info;
  ecs_entity_t prefab;
  void *ptr;
  int32_t p;
  ecs_entity_t *type_buffer;
  ecs_type_t type;
  ecs_entity_t component_local;
  ecs_entity_info_t *info_local;
  ecs_stage_t *stage_local;
  ecs_world_t *world_local;
  
  vector = info->table->type;
  pvVar2 = _ecs_vector_first(vector,8,0x10);
  ptr._4_4_ = -1;
  prefab = 0;
  while( true ) {
    bVar3 = false;
    if (prefab == 0) {
      ptr._4_4_ = find_prefab(vector,ptr._4_4_);
      bVar3 = ptr._4_4_ != -1;
    }
    if (!bVar3) break;
    prefab_info._24_8_ = *(ulong *)((long)pvVar2 + (long)ptr._4_4_ * 8) & 0xffffffffffffff;
    _Var1 = ecs_get_info(world,prefab_info._24_8_,(ecs_entity_info_t *)local_70);
    if (((_Var1) && (prefab_info.record != (ecs_record_t *)0x0)) &&
       (prefab = (ecs_entity_t)get_component((ecs_entity_info_t *)local_70,component),
       (void *)prefab == (void *)0x0)) {
      prefab = (ecs_entity_t)get_base_component(world,stage,(ecs_entity_info_t *)local_70,component)
      ;
    }
  }
  return (void *)prefab;
}

Assistant:

static
void* get_base_component(
    ecs_world_t * world,
    ecs_stage_t * stage,
    ecs_entity_info_t * info,
    ecs_entity_t component)
{
    ecs_type_t type = info->table->type;
    ecs_entity_t *type_buffer = ecs_vector_first(type, ecs_entity_t);
    int32_t p = -1;
    void *ptr = NULL;

    while (!ptr && (p = find_prefab(type, p)) != -1) {
        ecs_entity_t prefab = type_buffer[p] & ECS_COMPONENT_MASK;
        ecs_entity_info_t prefab_info;
        if (ecs_get_info(world, prefab, &prefab_info) && prefab_info.table) {
            ptr = get_component(&prefab_info, component);
            if (!ptr) {
                ptr = get_base_component(
                    world, stage, &prefab_info, component);
            }
        }
    }

    return ptr;
}